

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O1

int run_test(int inprocess)

{
  int iVar1;
  undefined1 *puVar2;
  undefined8 *extraout_RDX;
  int iVar3;
  undefined1 *puVar4;
  undefined1 auVar5 [16];
  uv_thread_t tid;
  uv_process_t process;
  undefined1 auStack_a8 [8];
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  uv_process_t local_90;
  
  puVar2 = auStack_98;
  puVar4 = auStack_98;
  if (inprocess == 0) {
    uStack_a0 = (code *)0x161ffc;
    spawn_helper(&ctx.channel,&local_90,"ipc_send_recv_helper");
    uStack_a0 = (code *)0x16200a;
    connect_cb(&ctx.connect_req,0);
LAB_0016200a:
    uStack_a0 = (code *)0x16200f;
    puVar2 = (undefined1 *)uv_default_loop();
    iVar3 = 0;
    uStack_a0 = (code *)0x162019;
    iVar1 = uv_run();
    if (iVar1 != 0) {
      uStack_a0 = (code *)0x162044;
      run_test_cold_3();
LAB_00162044:
      uStack_a0 = (code *)0x162049;
      run_test_cold_4();
LAB_00162049:
      uStack_a0 = (code *)0x16204e;
      run_test_cold_1();
      goto LAB_0016204e;
    }
    if (recv_cb_count != 2) goto LAB_00162044;
    if (inprocess == 0) {
      return 0;
    }
    uStack_a0 = (code *)0x162032;
    iVar1 = uv_thread_join();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar3 = 0x161f29;
    uStack_a0 = (code *)0x161f8e;
    iVar1 = uv_thread_create(auStack_98,ipc_send_recv_helper_threadproc,0x2a);
    if (iVar1 != 0) goto LAB_00162049;
    uStack_a0 = (code *)0x161fa0;
    uv_sleep(1000);
    uStack_a0 = (code *)0x161fa5;
    puVar2 = (undefined1 *)uv_default_loop();
    iVar3 = 0x2e6330;
    uStack_a0 = (code *)0x161fb9;
    iVar1 = uv_pipe_init(puVar2,&ctx,1);
    if (iVar1 == 0) {
      uStack_a0 = (code *)0x161fe2;
      uv_pipe_connect(0x2e6438,&ctx,"/tmp/uv-test-sock3",connect_cb);
      goto LAB_0016200a;
    }
LAB_0016204e:
    puVar4 = puVar2;
    uStack_a0 = (code *)0x162053;
    run_test_cold_2();
  }
  uStack_a0 = connect_cb;
  run_test_cold_5();
  if ((uv_connect_t *)puVar4 == &ctx.connect_req) {
    if (iVar3 != 0) goto LAB_00162128;
    _auStack_a8 = uv_buf_init(".",1);
    iVar1 = uv_write2(0x2e6498,&ctx,auStack_a8,1,0x2e6620,0);
    if (iVar1 != 0) goto LAB_0016212d;
    auVar5 = uv_buf_init(".",1);
    _auStack_a8 = auVar5;
    iVar1 = uv_write2(0x2e6558,&ctx,auStack_a8,1,0x2e6758,0);
    if (iVar1 == 0) {
      iVar1 = uv_read_start(&ctx,alloc_cb,recv_cb);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00162137;
    }
  }
  else {
    connect_cb_cold_1();
LAB_00162128:
    connect_cb_cold_2();
LAB_0016212d:
    connect_cb_cold_3();
  }
  connect_cb_cold_4();
LAB_00162137:
  connect_cb_cold_5();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 8;
  return 0x2e6b04;
}

Assistant:

static int run_test(int inprocess) {
  uv_process_t process;
  uv_thread_t tid;
  int r;

  if (inprocess) {
    r = uv_thread_create(&tid, ipc_send_recv_helper_threadproc, (void *) 42);
    ASSERT(r == 0);

    uv_sleep(1000);

    r = uv_pipe_init(uv_default_loop(), &ctx.channel, 1);
    ASSERT(r == 0);

    uv_pipe_connect(&ctx.connect_req, &ctx.channel, TEST_PIPENAME_3, connect_cb);
  } else {
    spawn_helper(&ctx.channel, &process, "ipc_send_recv_helper");

    connect_cb(&ctx.connect_req, 0);
  }

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(recv_cb_count == 2);

  if (inprocess) {
    r = uv_thread_join(&tid);
    ASSERT(r == 0);
  }

  return 0;
}